

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::TokenManager::SignMessage
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aSignature,Message *aMessage)

{
  string *this_00;
  ErrorCode EVar1;
  Sign1Message sign1Msg;
  ByteArray keyId;
  ByteArray externalData;
  Sign1Message SStack_c8;
  TokenManager *local_b8;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  char local_98 [16];
  ByteArray local_88;
  ByteArray local_68;
  ByteArray *local_50;
  ByteArray local_48;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = this;
  cose::Sign1Message::Sign1Message(&SStack_c8);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = aSignature;
  PrepareSigningContent((Error *)local_b0,&local_68,aMessage);
  __return_storage_ptr__->mCode = local_b0._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_a8._M_p != local_98) {
    operator_delete(local_a8._M_p);
  }
  if (EVar1 == kNone) {
    cose::Sign1Message::Init((Error *)local_b0,&SStack_c8,0);
    __return_storage_ptr__->mCode = local_b0._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_a8._M_p != local_98) {
      operator_delete(local_a8._M_p);
    }
    if (EVar1 == kNone) {
      cose::Sign1Message::AddAttribute((Error *)local_b0,&SStack_c8,1,-7,1);
      __return_storage_ptr__->mCode = local_b0._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
      EVar1 = __return_storage_ptr__->mCode;
      if (local_a8._M_p != local_98) {
        operator_delete(local_a8._M_p);
      }
      if (EVar1 == kNone) {
        GetKeyId((Error *)local_b0,local_b8,&local_88);
        __return_storage_ptr__->mCode = local_b0._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
        EVar1 = __return_storage_ptr__->mCode;
        if (local_a8._M_p != local_98) {
          operator_delete(local_a8._M_p);
        }
        if (EVar1 == kNone) {
          cose::Sign1Message::AddAttribute((Error *)local_b0,&SStack_c8,4,&local_88,2);
          __return_storage_ptr__->mCode = local_b0._0_4_;
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
          EVar1 = __return_storage_ptr__->mCode;
          if (local_a8._M_p != local_98) {
            operator_delete(local_a8._M_p);
          }
          if (EVar1 == kNone) {
            local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cose::Sign1Message::SetContent((Error *)local_b0,&SStack_c8,&local_48);
            __return_storage_ptr__->mCode = local_b0._0_4_;
            std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
            EVar1 = __return_storage_ptr__->mCode;
            if (local_a8._M_p != local_98) {
              operator_delete(local_a8._M_p);
            }
            if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (EVar1 == kNone) {
              cose::Sign1Message::SetExternalData((Error *)local_b0,&SStack_c8,&local_68);
              __return_storage_ptr__->mCode = local_b0._0_4_;
              std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
              EVar1 = __return_storage_ptr__->mCode;
              if (local_a8._M_p != local_98) {
                operator_delete(local_a8._M_p);
              }
              if (EVar1 == kNone) {
                cose::Sign1Message::Sign
                          ((Error *)local_b0,&SStack_c8,(mbedtls_pk_context *)&local_b8->mPrivateKey
                          );
                __return_storage_ptr__->mCode = local_b0._0_4_;
                std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
                EVar1 = __return_storage_ptr__->mCode;
                if (local_a8._M_p != local_98) {
                  operator_delete(local_a8._M_p);
                }
                if (EVar1 == kNone) {
                  cose::Sign1Message::Serialize((Error *)local_b0,&SStack_c8,local_50);
                  __return_storage_ptr__->mCode = local_b0._0_4_;
                  std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
                  EVar1 = __return_storage_ptr__->mCode;
                  if (local_a8._M_p != local_98) {
                    operator_delete(local_a8._M_p);
                  }
                  if (EVar1 == kNone) {
                    local_b8->mSequenceNumber = local_b8->mSequenceNumber + 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  cose::Sign1Message::Free(&SStack_c8);
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::SignMessage(ByteArray &aSignature, const coap::Message &aMessage)
{
    Error              error;
    ByteArray          externalData;
    cose::Sign1Message sign1Msg;
    ByteArray          keyId;

    SuccessOrExit(error = PrepareSigningContent(externalData, aMessage));

    SuccessOrExit(error = sign1Msg.Init(cose::kInitFlagsNone));
    SuccessOrExit(error = sign1Msg.AddAttribute(cose::kHeaderAlgorithm, cose::kAlgEcdsaWithSha256, cose::kProtectOnly));
#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
    // In case of getting Key ID failed, Use all-zero value by default.
    keyId.resize(kMaxCoseKeyIdLength);
    std::fill(keyId.begin(), keyId.end(), 0);
    IgnoreError(GetKeyId(keyId));
#else
    SuccessOrExit(error = GetKeyId(keyId));
#endif
    SuccessOrExit(error = sign1Msg.AddAttribute(cose::kHeaderKeyId, keyId, cose::kUnprotectOnly));

    // TODO(wgtdkp): set cose::kHeaderIV to mSequenceNumber.
    // SuccessOrExit(error = sign1Msg.AddAttribute(cose::kHeaderIV, , cose::kProtectOnly));
    SuccessOrExit(error = sign1Msg.SetContent({}));

    // The serialized message as external data for COSE signing.
    SuccessOrExit(error = sign1Msg.SetExternalData(externalData));

    SuccessOrExit(error = sign1Msg.Sign(mPrivateKey));
    SuccessOrExit(error = sign1Msg.Serialize(aSignature));

    // TODO(wgtdkp): synchronize to persist store.
    ++mSequenceNumber;

exit:
    sign1Msg.Free();
    return error;
}